

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O1

bool __thiscall SharedMemRingBuffer::Terminate(SharedMemRingBuffer *this)

{
  bool bVar1;
  
  bVar1 = SharedMemoryManager::DetachShMem(&this->shared_index_buffer_);
  if (bVar1) {
    bVar1 = SharedMemoryManager::RemoveShMem(&this->shared_index_buffer_);
    if (bVar1) {
      bVar1 = SharedMemoryManager::DetachShMem(&this->shared_raw_memory_buffer_);
      if (bVar1) {
        bVar1 = SharedMemoryManager::RemoveShMem(&this->shared_raw_memory_buffer_);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool SharedMemRingBuffer::Terminate()
{
    if(! shared_index_buffer_.DetachShMem()) {
        DEBUG_ELOG("Error"); 
        return false;
    }
    if(! shared_index_buffer_.RemoveShMem()) {
        DEBUG_ELOG("Error"); 
        return false;
    }
    if(! shared_raw_memory_buffer_.DetachShMem()) {
        DEBUG_ELOG("Error"); 
        return false;
    }
    if(! shared_raw_memory_buffer_.RemoveShMem()) {
        DEBUG_ELOG("Error"); 
        return false;
    }
    return true;
}